

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::SharedCodeGenerator
          (SharedCodeGenerator *this,FileDescriptor *file,Options *options)

{
  ClassNameResolver *this_00;
  Options *options_local;
  FileDescriptor *file_local;
  SharedCodeGenerator *this_local;
  
  this_00 = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00);
  std::
  unique_ptr<google::protobuf::compiler::java::ClassNameResolver,std::default_delete<google::protobuf::compiler::java::ClassNameResolver>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,void>
            ((unique_ptr<google::protobuf::compiler::java::ClassNameResolver,std::default_delete<google::protobuf::compiler::java::ClassNameResolver>>
              *)this,this_00);
  this->file_ = file;
  Options::Options(&this->options_,options);
  return;
}

Assistant:

SharedCodeGenerator::SharedCodeGenerator(const FileDescriptor* file,
                                         const Options& options)
    : name_resolver_(new ClassNameResolver), file_(file), options_(options) {}